

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_global_create_socket(int domain,int protocol)

{
  nn_socktype *socktype_00;
  uint fd;
  int iVar1;
  nn_sock *self;
  nn_sock *sock;
  nn_socktype *socktype;
  int i;
  int s;
  int rc;
  int protocol_local;
  int domain_local;
  
  if ((domain == 1) || (domain == 2)) {
    if (::self.nsocks < 0x200) {
      fd = (uint)::self.unused[0x1ff - ::self.nsocks];
      for (socktype._0_4_ = 0; socktype_00 = nn_socktypes[(int)socktype],
          socktype_00 != (nn_socktype *)0x0; socktype._0_4_ = (int)socktype + 1) {
        if ((socktype_00->domain == domain) && (socktype_00->protocol == protocol)) {
          self = (nn_sock *)nn_alloc_(0x250);
          if (self == (nn_sock *)0x0) {
            return -0xc;
          }
          iVar1 = nn_sock_init(self,socktype_00,fd);
          if (iVar1 < 0) {
            nn_free(self);
            return iVar1;
          }
          ::self.socks[(int)fd] = self;
          ::self.nsocks = ::self.nsocks + 1;
          return fd;
        }
      }
      protocol_local = -0x16;
    }
    else {
      protocol_local = -0x18;
    }
  }
  else {
    protocol_local = -0x61;
  }
  return protocol_local;
}

Assistant:

int nn_global_create_socket (int domain, int protocol)
{
    int rc;
    int s;
    int i;
    const struct nn_socktype *socktype;
    struct nn_sock *sock;

    /* The function is called with lock held */

    /*  Only AF_SP and AF_SP_RAW domains are supported. */
    if (domain != AF_SP && domain != AF_SP_RAW) {
        return -EAFNOSUPPORT;
    }

    /*  If socket limit was reached, report error. */
    if (self.nsocks >= NN_MAX_SOCKETS) {
        return -EMFILE;
    }

    /*  Find an empty socket slot. */
    s = self.unused [NN_MAX_SOCKETS - self.nsocks - 1];

    /*  Find the appropriate socket type. */
    for (i = 0; (socktype = nn_socktypes[i]) != NULL; i++) {
        if (socktype->domain == domain && socktype->protocol == protocol) {

            /*  Instantiate the socket. */
            if ((sock = nn_alloc (sizeof (struct nn_sock), "sock")) == NULL)
                return -ENOMEM;
            rc = nn_sock_init (sock, socktype, s);
            if (rc < 0) {
                nn_free (sock);
                return rc;
            }

            /*  Adjust the global socket table. */
            self.socks [s] = sock;
            ++self.nsocks;
            return s;
        }
    }
    /*  Specified socket type wasn't found. */
    return -EINVAL;
}